

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1506.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  CURL *pCVar5;
  int *piVar6;
  int iVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  timeval tVar11;
  undefined8 uStack_400;
  int maxfd;
  int running;
  char *local_3f0;
  timeval interval;
  CURL *curl [4];
  fd_set wr;
  fd_set rd;
  fd_set exc;
  char target_url [256];
  char dnsentry [256];
  
  pcVar8 = libtest_arg2;
  curl[2] = (CURL *)0x0;
  curl[3] = (CURL *)0x0;
  curl[0] = (CURL *)0x0;
  curl[1] = (CURL *)0x0;
  local_3f0 = libtest_arg3;
  iVar7 = 1;
  lVar3 = 0;
  do {
    lVar2 = lVar3;
    if (iVar7 == 5) {
      tv_test_start = tutil_tvnow();
      iVar7 = curl_global_init(3);
      uVar9 = _stderr;
      if (iVar7 != 0) {
        uVar4 = curl_easy_strerror(iVar7);
        curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                      ,0x3e,iVar7,uVar4);
        goto LAB_00102405;
      }
      lVar3 = curl_multi_init();
      if (lVar3 == 0) {
        lVar3 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                      ,0x40);
        iVar7 = 0x7b;
        goto LAB_00102373;
      }
      iVar7 = curl_multi_setopt(lVar3,6,3);
      uVar9 = _stderr;
      if (iVar7 == 0) {
        lVar10 = 0;
        goto LAB_001024aa;
      }
      uVar4 = curl_multi_strerror(iVar7);
      pcVar8 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
      uStack_400 = 0x42;
      goto LAB_00102460;
    }
    curl_msnprintf(dnsentry,0x100,"server%d.example.com:%s:%s",iVar7,local_3f0,pcVar8);
    curl_mprintf("%s\n",dnsentry);
    lVar3 = curl_slist_append(lVar2,dnsentry);
    iVar7 = iVar7 + 1;
  } while (lVar3 != 0);
  lVar3 = 0;
  curl_mfprintf(_stderr,"curl_slist_append() failed\n");
  iVar7 = 0;
  goto LAB_00102373;
LAB_001025b1:
  if (pcVar8 == (char *)0x4) goto LAB_00102373;
  local_3f0 = pcVar8;
  iVar1 = curl_multi_add_handle(lVar3,curl[(long)pcVar8]);
  uVar9 = _stderr;
  if (iVar1 != 0) {
    uVar4 = curl_multi_strerror(iVar1);
    pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
    uStack_400 = 0x5a;
    iVar7 = iVar1;
LAB_00102913:
    curl_mfprintf(uVar9,pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                  ,uStack_400,iVar7,uVar4);
    goto LAB_00102373;
  }
LAB_001025d5:
  maxfd = -99;
  interval.tv_sec = 1;
  interval.tv_usec = 0;
  iVar1 = curl_multi_perform(lVar3,&running);
  uVar9 = _stderr;
  if (iVar1 != 0) {
    uVar4 = curl_multi_strerror(iVar1);
    pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
    uStack_400 = 100;
    iVar7 = iVar1;
    goto LAB_00102913;
  }
  if (running < 0) {
    pcVar8 = 
    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
    uStack_400 = 100;
LAB_00102876:
    curl_mfprintf(_stderr,pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                  ,uStack_400);
    iVar7 = 0x7a;
    goto LAB_00102373;
  }
  tVar11 = tutil_tvnow();
  lVar10 = tutil_tvdiff(tVar11,tv_test_start);
  if (60000 < lVar10) {
    uStack_400 = 0x66;
    goto LAB_001028df;
  }
  if (running != 0) {
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      rd.__fds_bits[lVar10] = 0;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      wr.__fds_bits[lVar10] = 0;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      exc.__fds_bits[lVar10] = 0;
    }
    iVar1 = curl_multi_fdset(lVar3,&rd,&wr,&exc,&maxfd);
    uVar9 = _stderr;
    if (iVar1 == 0) {
      if (maxfd < -1) {
        pcVar8 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
        uStack_400 = 0x6f;
        goto LAB_00102876;
      }
      iVar1 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
      if (iVar1 != -1) goto code_r0x001026df;
      piVar6 = __errno_location();
      uVar9 = _stderr;
      iVar7 = *piVar6;
      pcVar8 = strerror(iVar7);
      curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                    ,0x73,iVar7,pcVar8);
      iVar7 = 0x79;
      goto LAB_00102373;
    }
    uVar4 = curl_multi_strerror(iVar1);
    pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
    uStack_400 = 0x6f;
    iVar7 = iVar1;
    goto LAB_00102913;
  }
  wait_ms(1);
  pcVar8 = local_3f0 + 1;
  goto LAB_001025b1;
code_r0x001026df:
  tVar11 = tutil_tvnow();
  lVar10 = tutil_tvdiff(tVar11,tv_test_start);
  if (60000 < lVar10) {
    uStack_400 = 0x75;
LAB_001028df:
    curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                  ,uStack_400);
    iVar7 = 0x7d;
    goto LAB_00102373;
  }
  goto LAB_001025d5;
  while( true ) {
    iVar7 = (int)lVar10 + 1;
    curl_msnprintf(target_url,0x100,"http://server%d.example.com:%s/path/1506%04i",iVar7,local_3f0,
                   iVar7);
    target_url[0xff] = '\0';
    iVar7 = curl_easy_setopt(pCVar5,0x2712,target_url);
    uVar9 = _stderr;
    if (iVar7 != 0) {
      uVar4 = curl_easy_strerror(iVar7);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_400 = 0x4d;
      goto LAB_00102460;
    }
    iVar7 = curl_easy_setopt(pCVar5,0x29,1);
    uVar9 = _stderr;
    if (iVar7 != 0) {
      uVar4 = curl_easy_strerror(iVar7);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_400 = 0x4f;
      goto LAB_00102460;
    }
    iVar7 = curl_easy_setopt(pCVar5,0x2a,1);
    uVar9 = _stderr;
    if (iVar7 != 0) {
      uVar4 = curl_easy_strerror(iVar7);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_400 = 0x51;
      goto LAB_00102460;
    }
    iVar7 = curl_easy_setopt(pCVar5,0x27db,lVar2);
    uVar9 = _stderr;
    lVar10 = lVar10 + 1;
    if (iVar7 != 0) break;
LAB_001024aa:
    if (lVar10 == 4) {
      iVar7 = 0;
      curl_mfprintf(_stderr,"Start at URL 0\n");
      pcVar8 = (char *)0x0;
      goto LAB_001025b1;
    }
    pCVar5 = (CURL *)curl_easy_init();
    curl[lVar10] = pCVar5;
    if (pCVar5 == (CURL *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                    ,0x47);
      iVar7 = 0x7c;
      goto LAB_00102373;
    }
  }
  uVar4 = curl_easy_strerror(iVar7);
  pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
  uStack_400 = 0x53;
LAB_00102460:
  curl_mfprintf(uVar9,pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1506.c"
                ,uStack_400,iVar7,uVar4);
LAB_00102373:
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    pCVar5 = curl[lVar10];
    curl_multi_remove_handle(lVar3,pCVar5);
    curl_easy_cleanup(pCVar5);
  }
  curl_slist_free_all(lVar2);
  curl_multi_cleanup(lVar3);
  curl_global_cleanup();
LAB_00102405:
  return iVar7;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {0};
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  char dnsentry[256];
  struct curl_slist *slist = NULL, *slist2;
  char *port = libtest_arg3;
  char *address = libtest_arg2;

  (void)URL;

  /* Create fake DNS entries for serverX.example.com for all handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    msnprintf(dnsentry, sizeof(dnsentry), "server%d.example.com:%s:%s",
              i + 1, port, address);
    printf("%s\n", dnsentry);
    slist2 = curl_slist_append(slist, dnsentry);
    if(!slist2) {
      fprintf(stderr, "curl_slist_append() failed\n");
      goto test_cleanup;
    }
    slist = slist2;
  }

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  multi_setopt(m, CURLMOPT_MAXCONNECTS, 3L);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url),
              "http://server%d.example.com:%s/path/1506%04i",
              i + 1, port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_RESOLVE, slist);
  }

  fprintf(stderr, "Start at URL 0\n");

  for(i = 0; i < NUM_HANDLES; i++) {
    /* add handle to multi */
    multi_add_handle(m, curl[i]);

    for(;;) {
      struct timeval interval;
      fd_set rd, wr, exc;
      int maxfd = -99;

      interval.tv_sec = 1;
      interval.tv_usec = 0;

      multi_perform(m, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&rd);
      FD_ZERO(&wr);
      FD_ZERO(&exc);

      multi_fdset(m, &rd, &wr, &exc, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      select_test(maxfd + 1, &rd, &wr, &exc, &interval);

      abort_on_test_timeout();
    }
    wait_ms(1); /* to ensure different end times */
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_slist_free_all(slist);

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}